

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
dynet::Softmax::forward_dev_impl<dynet::Device_CPU>
          (Softmax *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  pointer ppTVar1;
  Tensor *pTVar2;
  Tensor *pTVar3;
  float *pfVar4;
  float *pfVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  byte bVar10;
  byte bVar11;
  StorageIndex i;
  long lVar12;
  ulong uVar13;
  runtime_error *this_00;
  ulong uVar14;
  float *pfVar15;
  ulong uVar16;
  float *pfVar17;
  long lVar18;
  ushort uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  uint uVar43;
  uint uVar44;
  float fVar45;
  undefined1 extraout_var [60];
  type local_160;
  undefined1 local_118 [16];
  undefined1 local_108 [48];
  vector<dynet::Tensor,_std::allocator<dynet::Tensor>_> local_d8;
  Device *local_c0;
  DeviceMempool local_b8;
  TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>
  local_b0;
  type local_a0;
  undefined1 local_88 [48];
  vector<dynet::Tensor,_std::allocator<dynet::Tensor>_> local_58;
  Device *local_40;
  DeviceMempool local_38;
  
  ppTVar1 = (xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = *ppTVar1;
  if ((1 < (pTVar2->d).nd) && ((pTVar2->d).d[1] != 1)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Softmax not yet implemented for multiple columns");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_108._32_4_ = (fx->d).bd;
  local_108._40_8_ = (this->super_Node).aux_mem;
  local_c0 = fx->device;
  local_108._0_4_ = 1;
  local_108._28_4_ = 1;
  local_d8.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8 = FXS;
  local_88._40_8_ = local_108._40_8_ + (ulong)(uint)local_108._32_4_ * 4;
  local_88._0_4_ = 1;
  local_88._4_4_ = SUB84(local_160.m_xpr.m_lhs_xpr.m_data,0);
  local_88._8_4_ = (undefined4)((ulong)local_160.m_xpr.m_lhs_xpr.m_data >> 0x20);
  local_88._12_4_ =
       (undefined4)local_160.m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0];
  local_88._16_4_ =
       (undefined4)
       ((ulong)local_160.m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] >> 0x20);
  local_88._20_4_ =
       (undefined4)local_160.m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1];
  local_88._24_4_ =
       (undefined4)
       ((ulong)local_160.m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] >> 0x20);
  local_88._28_4_ = 1;
  local_58.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = FXS;
  local_88._32_4_ = local_108._32_4_;
  local_40 = local_c0;
  logsumexp<dynet::Device_CPU>(dev,*ppTVar1,(Tensor *)local_88,(Tensor *)local_108);
  lVar12 = (long)(int)(fx->d).bd;
  ppTVar1 = (xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = *ppTVar1;
  if (lVar12 == 1) {
    if ((pTVar2->d).bd != 1) goto LAB_00356e8b;
    uVar43 = (pTVar2->d).nd;
    uVar13 = (ulong)uVar43;
    if (uVar13 == 0) {
      uVar43 = 1;
LAB_00356a22:
      if (uVar43 != (pTVar2->d).d[0]) {
LAB_00356e8b:
        __assert_fail("d.batch_elems() == 1 && (d.ndims() == 1 || d.size() == d.rows())",
                      "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                      ,0xba,
                      "const Eigen::TensorMap<Eigen::Tensor<float, 1>> dynet::Tensor::t() const");
      }
    }
    else if (uVar43 != 1) {
      auVar22 = vpbroadcastq_avx512f();
      auVar23 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar16 = 0;
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar26 = vmovdqa64_avx512f(auVar23);
        auVar23 = vpbroadcastq_avx512f();
        auVar27 = vporq_avx512f(auVar23,auVar24);
        auVar23 = vporq_avx512f(auVar23,auVar25);
        uVar9 = vpcmpuq_avx512f(auVar23,auVar22,2);
        bVar10 = (byte)uVar9;
        uVar9 = vpcmpuq_avx512f(auVar27,auVar22,2);
        bVar11 = (byte)uVar9;
        uVar19 = CONCAT11(bVar11,bVar10);
        auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar2->d).d + uVar16));
        auVar27._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar23._4_4_;
        auVar27._0_4_ = (uint)(bVar10 & 1) * auVar23._0_4_;
        auVar27._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar23._8_4_;
        auVar27._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar23._12_4_;
        auVar27._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar23._16_4_;
        auVar27._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar23._20_4_;
        auVar27._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar23._24_4_;
        auVar27._28_4_ = (uint)((byte)(uVar19 >> 7) & 1) * auVar23._28_4_;
        auVar27._32_4_ = (uint)(bVar11 & 1) * auVar23._32_4_;
        auVar27._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar23._36_4_;
        auVar27._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar23._40_4_;
        auVar27._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar23._44_4_;
        auVar27._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar23._48_4_;
        auVar27._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar23._52_4_;
        auVar27._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar23._56_4_;
        auVar27._60_4_ = (uint)(bVar11 >> 7) * auVar23._60_4_;
        auVar23 = vpmulld_avx512f(auVar27,auVar26);
        uVar16 = uVar16 + 0x10;
      } while ((uVar13 + 0xf & 0xfffffffffffffff0) != uVar16);
      auVar22 = vmovdqa32_avx512f(auVar23);
      auVar23._0_4_ = (uint)(bVar10 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar26._0_4_
      ;
      bVar6 = (bool)((byte)(uVar19 >> 1) & 1);
      auVar23._4_4_ = (uint)bVar6 * auVar22._4_4_ | (uint)!bVar6 * auVar26._4_4_;
      bVar6 = (bool)((byte)(uVar19 >> 2) & 1);
      auVar23._8_4_ = (uint)bVar6 * auVar22._8_4_ | (uint)!bVar6 * auVar26._8_4_;
      bVar6 = (bool)((byte)(uVar19 >> 3) & 1);
      auVar23._12_4_ = (uint)bVar6 * auVar22._12_4_ | (uint)!bVar6 * auVar26._12_4_;
      bVar6 = (bool)((byte)(uVar19 >> 4) & 1);
      auVar23._16_4_ = (uint)bVar6 * auVar22._16_4_ | (uint)!bVar6 * auVar26._16_4_;
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      auVar23._20_4_ = (uint)bVar6 * auVar22._20_4_ | (uint)!bVar6 * auVar26._20_4_;
      bVar6 = (bool)((byte)(uVar19 >> 6) & 1);
      auVar23._24_4_ = (uint)bVar6 * auVar22._24_4_ | (uint)!bVar6 * auVar26._24_4_;
      bVar6 = (bool)((byte)(uVar19 >> 7) & 1);
      auVar23._28_4_ = (uint)bVar6 * auVar22._28_4_ | (uint)!bVar6 * auVar26._28_4_;
      auVar23._32_4_ =
           (uint)(bVar11 & 1) * auVar22._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar26._32_4_;
      bVar6 = (bool)(bVar11 >> 1 & 1);
      auVar23._36_4_ = (uint)bVar6 * auVar22._36_4_ | (uint)!bVar6 * auVar26._36_4_;
      bVar6 = (bool)(bVar11 >> 2 & 1);
      auVar23._40_4_ = (uint)bVar6 * auVar22._40_4_ | (uint)!bVar6 * auVar26._40_4_;
      bVar6 = (bool)(bVar11 >> 3 & 1);
      auVar23._44_4_ = (uint)bVar6 * auVar22._44_4_ | (uint)!bVar6 * auVar26._44_4_;
      bVar6 = (bool)(bVar11 >> 4 & 1);
      auVar23._48_4_ = (uint)bVar6 * auVar22._48_4_ | (uint)!bVar6 * auVar26._48_4_;
      bVar6 = (bool)(bVar11 >> 5 & 1);
      auVar23._52_4_ = (uint)bVar6 * auVar22._52_4_ | (uint)!bVar6 * auVar26._52_4_;
      bVar6 = (bool)(bVar11 >> 6 & 1);
      auVar23._56_4_ = (uint)bVar6 * auVar22._56_4_ | (uint)!bVar6 * auVar26._56_4_;
      auVar23._60_4_ =
           (uint)(bVar11 >> 7) * auVar22._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar26._60_4_;
      auVar21 = vextracti64x4_avx512f(auVar23,1);
      auVar22 = vpmulld_avx512f(auVar23,ZEXT3264(auVar21));
      auVar20 = vpmulld_avx(auVar22._0_16_,auVar22._16_16_);
      auVar7 = vpshufd_avx(auVar20,0xee);
      auVar20 = vpmulld_avx(auVar20,auVar7);
      auVar7 = vpshufd_avx(auVar20,0x55);
      auVar20 = vpmulld_avx(auVar20,auVar7);
      uVar43 = auVar20._0_4_;
      goto LAB_00356a22;
    }
    uVar43 = 1;
    if (uVar13 != 0) {
      uVar43 = (pTVar2->d).d[0];
    }
    pfVar4 = pTVar2->v;
    auVar22._0_4_ = as_scalar((Tensor *)local_108);
    auVar22._4_60_ = extraout_var;
    if ((fx->d).bd != 1) goto LAB_00356ead;
    auVar20 = vmovdqa64_avx512vl(auVar22._0_16_);
    uVar44 = (fx->d).nd;
    uVar13 = (ulong)uVar44;
    if (uVar13 == 0) {
      uVar44 = 1;
LAB_00356b22:
      if (uVar44 != (fx->d).d[0]) {
LAB_00356ead:
        __assert_fail("d.batch_elems() == 1 && (d.ndims() == 1 || d.size() == d.rows())",
                      "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                      ,0xb6,"Eigen::TensorMap<Eigen::Tensor<float, 1>> dynet::Tensor::t()");
      }
    }
    else if (uVar44 != 1) {
      auVar22 = vpbroadcastq_avx512f();
      auVar23 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar16 = 0;
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar26 = vmovdqa64_avx512f(auVar23);
        auVar23 = vpbroadcastq_avx512f();
        auVar27 = vporq_avx512f(auVar23,auVar24);
        auVar23 = vporq_avx512f(auVar23,auVar25);
        uVar9 = vpcmpuq_avx512f(auVar23,auVar22,2);
        bVar10 = (byte)uVar9;
        uVar9 = vpcmpuq_avx512f(auVar27,auVar22,2);
        bVar11 = (byte)uVar9;
        uVar19 = CONCAT11(bVar11,bVar10);
        auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar16));
        auVar28._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar23._4_4_;
        auVar28._0_4_ = (uint)(bVar10 & 1) * auVar23._0_4_;
        auVar28._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar23._8_4_;
        auVar28._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar23._12_4_;
        auVar28._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar23._16_4_;
        auVar28._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar23._20_4_;
        auVar28._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar23._24_4_;
        auVar28._28_4_ = (uint)((byte)(uVar19 >> 7) & 1) * auVar23._28_4_;
        auVar28._32_4_ = (uint)(bVar11 & 1) * auVar23._32_4_;
        auVar28._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar23._36_4_;
        auVar28._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar23._40_4_;
        auVar28._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar23._44_4_;
        auVar28._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar23._48_4_;
        auVar28._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar23._52_4_;
        auVar28._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar23._56_4_;
        auVar28._60_4_ = (uint)(bVar11 >> 7) * auVar23._60_4_;
        auVar23 = vpmulld_avx512f(auVar28,auVar26);
        uVar16 = uVar16 + 0x10;
      } while ((uVar13 + 0xf & 0xfffffffffffffff0) != uVar16);
      auVar22 = vmovdqa32_avx512f(auVar23);
      auVar24._0_4_ = (uint)(bVar10 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar26._0_4_
      ;
      bVar6 = (bool)((byte)(uVar19 >> 1) & 1);
      auVar24._4_4_ = (uint)bVar6 * auVar22._4_4_ | (uint)!bVar6 * auVar26._4_4_;
      bVar6 = (bool)((byte)(uVar19 >> 2) & 1);
      auVar24._8_4_ = (uint)bVar6 * auVar22._8_4_ | (uint)!bVar6 * auVar26._8_4_;
      bVar6 = (bool)((byte)(uVar19 >> 3) & 1);
      auVar24._12_4_ = (uint)bVar6 * auVar22._12_4_ | (uint)!bVar6 * auVar26._12_4_;
      bVar6 = (bool)((byte)(uVar19 >> 4) & 1);
      auVar24._16_4_ = (uint)bVar6 * auVar22._16_4_ | (uint)!bVar6 * auVar26._16_4_;
      bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
      auVar24._20_4_ = (uint)bVar6 * auVar22._20_4_ | (uint)!bVar6 * auVar26._20_4_;
      bVar6 = (bool)((byte)(uVar19 >> 6) & 1);
      auVar24._24_4_ = (uint)bVar6 * auVar22._24_4_ | (uint)!bVar6 * auVar26._24_4_;
      bVar6 = (bool)((byte)(uVar19 >> 7) & 1);
      auVar24._28_4_ = (uint)bVar6 * auVar22._28_4_ | (uint)!bVar6 * auVar26._28_4_;
      auVar24._32_4_ =
           (uint)(bVar11 & 1) * auVar22._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar26._32_4_;
      bVar6 = (bool)(bVar11 >> 1 & 1);
      auVar24._36_4_ = (uint)bVar6 * auVar22._36_4_ | (uint)!bVar6 * auVar26._36_4_;
      bVar6 = (bool)(bVar11 >> 2 & 1);
      auVar24._40_4_ = (uint)bVar6 * auVar22._40_4_ | (uint)!bVar6 * auVar26._40_4_;
      bVar6 = (bool)(bVar11 >> 3 & 1);
      auVar24._44_4_ = (uint)bVar6 * auVar22._44_4_ | (uint)!bVar6 * auVar26._44_4_;
      bVar6 = (bool)(bVar11 >> 4 & 1);
      auVar24._48_4_ = (uint)bVar6 * auVar22._48_4_ | (uint)!bVar6 * auVar26._48_4_;
      bVar6 = (bool)(bVar11 >> 5 & 1);
      auVar24._52_4_ = (uint)bVar6 * auVar22._52_4_ | (uint)!bVar6 * auVar26._52_4_;
      bVar6 = (bool)(bVar11 >> 6 & 1);
      auVar24._56_4_ = (uint)bVar6 * auVar22._56_4_ | (uint)!bVar6 * auVar26._56_4_;
      auVar24._60_4_ =
           (uint)(bVar11 >> 7) * auVar22._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar26._60_4_;
      auVar21 = vextracti64x4_avx512f(auVar24,1);
      auVar22 = vpmulld_avx512f(auVar24,ZEXT3264(auVar21));
      auVar7 = vpmulld_avx(auVar22._0_16_,auVar22._16_16_);
      auVar8 = vpshufd_avx(auVar7,0xee);
      auVar7 = vpmulld_avx(auVar7,auVar8);
      auVar8 = vpshufd_avx(auVar7,0x55);
      auVar7 = vpmulld_avx(auVar7,auVar8);
      uVar44 = auVar7._0_4_;
      goto LAB_00356b22;
    }
    uVar44 = 1;
    if (uVar13 != 0) {
      uVar44 = (fx->d).d[0];
    }
    if (uVar44 != uVar43) {
      __assert_fail("dimensions_match(m_leftImpl.dimensions(), m_rightImpl.dimensions())",
                    "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorAssign.h",0x92,
                    "bool Eigen::TensorEvaluator<const Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float, 1>>, const Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>, const Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float>>, const Eigen::TensorMap<Eigen::Tensor<float, 1>>>>>, Eigen::DefaultDevice>::evalSubExprsIfNeeded(EvaluatorPointerType) [Derived = const Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float, 1>>, const Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>, const Eigen::TensorCwiseUnaryOp<Eigen::internal::bind2nd_op<Eigen::internal::scalar_difference_op<float>>, const Eigen::TensorMap<Eigen::Tensor<float, 1>>>>>, Device = Eigen::DefaultDevice]"
                   );
    }
    uVar16 = (ulong)(int)uVar43;
    pfVar5 = fx->v;
    uVar13 = uVar16 + 0x3f;
    if (-1 < (long)uVar16) {
      uVar13 = uVar16;
    }
    uVar13 = uVar13 & 0xffffffffffffffc0;
    if (0x3f < (int)uVar43) {
      auVar22 = vpbroadcastd_avx512f(auVar20);
      lVar12 = 0;
      auVar23 = vbroadcastss_avx512f(ZEXT416(0x42b0c0a6));
      auVar24 = vbroadcastss_avx512f(ZEXT416(0xc2b0c0a5));
      auVar25 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
      auVar26 = vbroadcastss_avx512f(ZEXT416(0x3fb8aa3b));
      auVar27 = vbroadcastss_avx512f(ZEXT416(0xbf317218));
      auVar28 = vbroadcastss_avx512f(ZEXT416(0x39506967));
      auVar29 = vbroadcastss_avx512f(ZEXT416(0x3ab743ce));
      auVar30 = vbroadcastss_avx512f(ZEXT416(0x3d2aa9c1));
      auVar31 = vbroadcastss_avx512f(ZEXT416(0x3e2aaaaa));
      auVar32 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar33 = vbroadcastss_avx512f(ZEXT416(0x3c088908));
      auVar34 = vbroadcastss_avx512f(ZEXT416(0x42fe0000));
      pfVar15 = pfVar4;
      pfVar17 = pfVar5;
      do {
        lVar18 = 0;
        do {
          auVar35 = vsubps_avx512f(*(undefined1 (*) [64])((long)pfVar15 + lVar18),auVar22);
          auVar36 = vminps_avx512f(auVar35,auVar23);
          auVar36 = vmaxps_avx512f(auVar36,auVar24);
          auVar37 = vfmadd231ps_avx512f(auVar25,auVar36,auVar26);
          auVar37 = vrndscaleps_avx512f(auVar37,1);
          auVar36 = vfmadd231ps_avx512f(auVar36,auVar37,auVar27);
          auVar38 = vmulps_avx512f(auVar36,auVar36);
          auVar39 = vmulps_avx512f(auVar38,auVar36);
          auVar40 = vfmadd213ps_avx512f(auVar28,auVar36,auVar29);
          auVar41 = vfmadd213ps_avx512f(auVar30,auVar36,auVar31);
          auVar42 = vaddps_avx512f(auVar36,auVar32);
          auVar40 = vfmadd213ps_avx512f(auVar40,auVar36,auVar33);
          auVar36 = vfmadd213ps_avx512f(auVar41,auVar36,auVar25);
          auVar36 = vfmadd231ps_avx512f(auVar36,auVar39,auVar40);
          auVar36 = vfmadd213ps_avx512f(auVar36,auVar38,auVar42);
          auVar37 = vaddps_avx512f(auVar37,auVar34);
          auVar37 = vcvttps2dq_avx512f(auVar37);
          auVar37 = vpslld_avx512f(auVar37,0x17);
          auVar36 = vmulps_avx512f(auVar36,auVar37);
          auVar35 = vmaxps_avx512f(auVar35,auVar36);
          *(undefined1 (*) [64])((long)pfVar17 + lVar18) = auVar35;
          lVar18 = lVar18 + 0x40;
        } while (lVar18 != 0x100);
        lVar12 = lVar12 + 0x40;
        pfVar17 = pfVar17 + 0x40;
        pfVar15 = pfVar15 + 0x40;
      } while (lVar12 < (long)uVar13);
    }
    uVar14 = uVar16 + 0xf;
    if (-1 < (long)uVar16) {
      uVar14 = uVar16;
    }
    uVar14 = uVar14 & 0xfffffffffffffff0;
    if ((long)uVar13 < (long)uVar14) {
      auVar22 = vpbroadcastd_avx512f(auVar20);
      auVar23 = vbroadcastss_avx512f(ZEXT416(0x42b0c0a6));
      auVar24 = vbroadcastss_avx512f(ZEXT416(0xc2b0c0a5));
      auVar25 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
      auVar26 = vbroadcastss_avx512f(ZEXT416(0x3fb8aa3b));
      auVar27 = vbroadcastss_avx512f(ZEXT416(0xbf317218));
      auVar28 = vbroadcastss_avx512f(ZEXT416(0x39506967));
      auVar29 = vbroadcastss_avx512f(ZEXT416(0x3ab743ce));
      auVar30 = vbroadcastss_avx512f(ZEXT416(0x3d2aa9c1));
      auVar31 = vbroadcastss_avx512f(ZEXT416(0x3e2aaaaa));
      auVar32 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar33 = vbroadcastss_avx512f(ZEXT416(0x3c088908));
      auVar34 = vbroadcastss_avx512f(ZEXT416(0x42fe0000));
      do {
        auVar35 = vsubps_avx512f(*(undefined1 (*) [64])(pfVar4 + uVar13),auVar22);
        auVar36 = vminps_avx512f(auVar35,auVar23);
        auVar36 = vmaxps_avx512f(auVar36,auVar24);
        auVar37 = vfmadd231ps_avx512f(auVar25,auVar36,auVar26);
        auVar37 = vrndscaleps_avx512f(auVar37,1);
        auVar36 = vfmadd231ps_avx512f(auVar36,auVar37,auVar27);
        auVar38 = vmulps_avx512f(auVar36,auVar36);
        auVar39 = vmulps_avx512f(auVar38,auVar36);
        auVar40 = vfmadd213ps_avx512f(auVar28,auVar36,auVar29);
        auVar41 = vfmadd213ps_avx512f(auVar30,auVar36,auVar31);
        auVar42 = vaddps_avx512f(auVar36,auVar32);
        auVar40 = vfmadd213ps_avx512f(auVar40,auVar36,auVar33);
        auVar36 = vfmadd213ps_avx512f(auVar41,auVar36,auVar25);
        auVar36 = vfmadd231ps_avx512f(auVar36,auVar39,auVar40);
        auVar36 = vfmadd213ps_avx512f(auVar36,auVar38,auVar42);
        auVar37 = vaddps_avx512f(auVar37,auVar34);
        auVar37 = vcvttps2dq_avx512f(auVar37);
        auVar37 = vpslld_avx512f(auVar37,0x17);
        auVar36 = vmulps_avx512f(auVar36,auVar37);
        auVar35 = vmaxps_avx512f(auVar35,auVar36);
        *(undefined1 (*) [64])(pfVar5 + uVar13) = auVar35;
        uVar13 = uVar13 + 0x10;
      } while ((long)uVar13 < (long)uVar14);
    }
    if ((long)uVar14 < (long)uVar16) {
      if (pfVar4 == (float *)0x0) {
        __assert_fail("m_data != __null",
                      "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h",
                      0x123,
                      "CoeffReturnType Eigen::TensorEvaluator<const Eigen::TensorMap<Eigen::Tensor<float, 1>>, Eigen::DefaultDevice>::coeff(Index) const [Derived = const Eigen::TensorMap<Eigen::Tensor<float, 1>>, Device = Eigen::DefaultDevice]"
                     );
      }
      if (pfVar5 == (float *)0x0) {
        __assert_fail("m_data != __null",
                      "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h",100
                      ,
                      "CoeffReturnType &Eigen::TensorEvaluator<Eigen::TensorMap<Eigen::Tensor<float, 1>>, Eigen::DefaultDevice>::coeffRef(Index) [Derived = Eigen::TensorMap<Eigen::Tensor<float, 1>>, Device = Eigen::DefaultDevice]"
                     );
      }
      local_118 = vmovdqa64_avx512vl(auVar20);
      do {
        auVar20 = vsubss_avx512f(ZEXT416((uint)pfVar4[uVar14]),auVar20);
        fVar45 = expf(auVar20._0_4_);
        pfVar5[uVar14] = fVar45;
        uVar14 = uVar14 + 1;
        auVar20 = local_118;
      } while (uVar16 != uVar14);
    }
    goto LAB_00356e34;
  }
  pTVar3 = *ppTVar1;
  uVar43 = (pTVar3->d).nd;
  uVar13 = (ulong)uVar43;
  if (uVar13 == 0) {
    uVar43 = 1;
LAB_003567c3:
    if (uVar43 != (pTVar3->d).d[0]) {
      __assert_fail("d.ndims() == 1 || d.batch_size() == d.rows()",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                    ,0xf0,
                    "const Eigen::TensorMap<Eigen::Tensor<float, 2>> dynet::Tensor::tb() const");
    }
  }
  else if (uVar43 != 1) {
    auVar22 = vpbroadcastq_avx512f();
    auVar23 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar16 = 0;
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar26 = vmovdqa64_avx512f(auVar23);
      auVar23 = vpbroadcastq_avx512f();
      auVar27 = vporq_avx512f(auVar23,auVar24);
      auVar23 = vporq_avx512f(auVar23,auVar25);
      uVar9 = vpcmpuq_avx512f(auVar23,auVar22,2);
      bVar10 = (byte)uVar9;
      uVar9 = vpcmpuq_avx512f(auVar27,auVar22,2);
      bVar11 = (byte)uVar9;
      uVar19 = CONCAT11(bVar11,bVar10);
      auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar3->d).d + uVar16));
      auVar29._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar23._4_4_;
      auVar29._0_4_ = (uint)(bVar10 & 1) * auVar23._0_4_;
      auVar29._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar23._8_4_;
      auVar29._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar23._12_4_;
      auVar29._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar23._16_4_;
      auVar29._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar23._20_4_;
      auVar29._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar23._24_4_;
      auVar29._28_4_ = (uint)((byte)(uVar19 >> 7) & 1) * auVar23._28_4_;
      auVar29._32_4_ = (uint)(bVar11 & 1) * auVar23._32_4_;
      auVar29._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar23._36_4_;
      auVar29._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar23._40_4_;
      auVar29._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar23._44_4_;
      auVar29._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar23._48_4_;
      auVar29._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar23._52_4_;
      auVar29._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar23._56_4_;
      auVar29._60_4_ = (uint)(bVar11 >> 7) * auVar23._60_4_;
      auVar23 = vpmulld_avx512f(auVar29,auVar26);
      uVar16 = uVar16 + 0x10;
    } while ((uVar13 + 0xf & 0xfffffffffffffff0) != uVar16);
    auVar22 = vmovdqa32_avx512f(auVar23);
    auVar25._0_4_ = (uint)(bVar10 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar26._0_4_;
    bVar6 = (bool)((byte)(uVar19 >> 1) & 1);
    auVar25._4_4_ = (uint)bVar6 * auVar22._4_4_ | (uint)!bVar6 * auVar26._4_4_;
    bVar6 = (bool)((byte)(uVar19 >> 2) & 1);
    auVar25._8_4_ = (uint)bVar6 * auVar22._8_4_ | (uint)!bVar6 * auVar26._8_4_;
    bVar6 = (bool)((byte)(uVar19 >> 3) & 1);
    auVar25._12_4_ = (uint)bVar6 * auVar22._12_4_ | (uint)!bVar6 * auVar26._12_4_;
    bVar6 = (bool)((byte)(uVar19 >> 4) & 1);
    auVar25._16_4_ = (uint)bVar6 * auVar22._16_4_ | (uint)!bVar6 * auVar26._16_4_;
    bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
    auVar25._20_4_ = (uint)bVar6 * auVar22._20_4_ | (uint)!bVar6 * auVar26._20_4_;
    bVar6 = (bool)((byte)(uVar19 >> 6) & 1);
    auVar25._24_4_ = (uint)bVar6 * auVar22._24_4_ | (uint)!bVar6 * auVar26._24_4_;
    bVar6 = (bool)((byte)(uVar19 >> 7) & 1);
    auVar25._28_4_ = (uint)bVar6 * auVar22._28_4_ | (uint)!bVar6 * auVar26._28_4_;
    auVar25._32_4_ =
         (uint)(bVar11 & 1) * auVar22._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar26._32_4_;
    bVar6 = (bool)(bVar11 >> 1 & 1);
    auVar25._36_4_ = (uint)bVar6 * auVar22._36_4_ | (uint)!bVar6 * auVar26._36_4_;
    bVar6 = (bool)(bVar11 >> 2 & 1);
    auVar25._40_4_ = (uint)bVar6 * auVar22._40_4_ | (uint)!bVar6 * auVar26._40_4_;
    bVar6 = (bool)(bVar11 >> 3 & 1);
    auVar25._44_4_ = (uint)bVar6 * auVar22._44_4_ | (uint)!bVar6 * auVar26._44_4_;
    bVar6 = (bool)(bVar11 >> 4 & 1);
    auVar25._48_4_ = (uint)bVar6 * auVar22._48_4_ | (uint)!bVar6 * auVar26._48_4_;
    bVar6 = (bool)(bVar11 >> 5 & 1);
    auVar25._52_4_ = (uint)bVar6 * auVar22._52_4_ | (uint)!bVar6 * auVar26._52_4_;
    bVar6 = (bool)(bVar11 >> 6 & 1);
    auVar25._56_4_ = (uint)bVar6 * auVar22._56_4_ | (uint)!bVar6 * auVar26._56_4_;
    auVar25._60_4_ =
         (uint)(bVar11 >> 7) * auVar22._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar26._60_4_;
    auVar21 = vextracti64x4_avx512f(auVar25,1);
    auVar22 = vpmulld_avx512f(auVar25,ZEXT3264(auVar21));
    auVar20 = vpmulld_avx(auVar22._0_16_,auVar22._16_16_);
    auVar7 = vpshufd_avx(auVar20,0xee);
    auVar20 = vpmulld_avx(auVar20,auVar7);
    auVar7 = vpshufd_avx(auVar20,0x55);
    auVar20 = vpmulld_avx(auVar20,auVar7);
    uVar43 = auVar20._0_4_;
    goto LAB_003567c3;
  }
  uVar44 = 1;
  uVar43 = 1;
  if (uVar13 != 0) {
    uVar43 = (pTVar3->d).d[0];
  }
  lVar18 = (long)(int)(pTVar3->d).bd;
  uVar13 = (ulong)(uint)local_108._28_4_;
  if (uVar13 == 0) {
LAB_003568ab:
    if (uVar44 != local_108._0_4_) goto LAB_00356ecf;
  }
  else if (local_108._28_4_ != 1) {
    auVar22 = vpbroadcastq_avx512f();
    auVar23 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar16 = 0;
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar26 = vmovdqa64_avx512f(auVar23);
      auVar23 = vpbroadcastq_avx512f();
      auVar27 = vporq_avx512f(auVar23,auVar24);
      auVar23 = vporq_avx512f(auVar23,auVar25);
      uVar9 = vpcmpuq_avx512f(auVar23,auVar22,2);
      bVar10 = (byte)uVar9;
      uVar9 = vpcmpuq_avx512f(auVar27,auVar22,2);
      bVar11 = (byte)uVar9;
      uVar19 = CONCAT11(bVar11,bVar10);
      auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_108 + uVar16 * 4));
      auVar30._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar23._4_4_;
      auVar30._0_4_ = (uint)(bVar10 & 1) * auVar23._0_4_;
      auVar30._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar23._8_4_;
      auVar30._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar23._12_4_;
      auVar30._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar23._16_4_;
      auVar30._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar23._20_4_;
      auVar30._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar23._24_4_;
      auVar30._28_4_ = (uint)((byte)(uVar19 >> 7) & 1) * auVar23._28_4_;
      auVar30._32_4_ = (uint)(bVar11 & 1) * auVar23._32_4_;
      auVar30._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar23._36_4_;
      auVar30._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar23._40_4_;
      auVar30._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar23._44_4_;
      auVar30._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar23._48_4_;
      auVar30._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar23._52_4_;
      auVar30._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar23._56_4_;
      auVar30._60_4_ = (uint)(bVar11 >> 7) * auVar23._60_4_;
      auVar23 = vpmulld_avx512f(auVar30,auVar26);
      uVar16 = uVar16 + 0x10;
    } while ((uVar13 + 0xf & 0xfffffffffffffff0) != uVar16);
    auVar22 = vmovdqa32_avx512f(auVar23);
    auVar31._0_4_ = (uint)(bVar10 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar26._0_4_;
    bVar6 = (bool)((byte)(uVar19 >> 1) & 1);
    auVar31._4_4_ = (uint)bVar6 * auVar22._4_4_ | (uint)!bVar6 * auVar26._4_4_;
    bVar6 = (bool)((byte)(uVar19 >> 2) & 1);
    auVar31._8_4_ = (uint)bVar6 * auVar22._8_4_ | (uint)!bVar6 * auVar26._8_4_;
    bVar6 = (bool)((byte)(uVar19 >> 3) & 1);
    auVar31._12_4_ = (uint)bVar6 * auVar22._12_4_ | (uint)!bVar6 * auVar26._12_4_;
    bVar6 = (bool)((byte)(uVar19 >> 4) & 1);
    auVar31._16_4_ = (uint)bVar6 * auVar22._16_4_ | (uint)!bVar6 * auVar26._16_4_;
    bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
    auVar31._20_4_ = (uint)bVar6 * auVar22._20_4_ | (uint)!bVar6 * auVar26._20_4_;
    bVar6 = (bool)((byte)(uVar19 >> 6) & 1);
    auVar31._24_4_ = (uint)bVar6 * auVar22._24_4_ | (uint)!bVar6 * auVar26._24_4_;
    bVar6 = (bool)((byte)(uVar19 >> 7) & 1);
    auVar31._28_4_ = (uint)bVar6 * auVar22._28_4_ | (uint)!bVar6 * auVar26._28_4_;
    auVar31._32_4_ =
         (uint)(bVar11 & 1) * auVar22._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar26._32_4_;
    bVar6 = (bool)(bVar11 >> 1 & 1);
    auVar31._36_4_ = (uint)bVar6 * auVar22._36_4_ | (uint)!bVar6 * auVar26._36_4_;
    bVar6 = (bool)(bVar11 >> 2 & 1);
    auVar31._40_4_ = (uint)bVar6 * auVar22._40_4_ | (uint)!bVar6 * auVar26._40_4_;
    bVar6 = (bool)(bVar11 >> 3 & 1);
    auVar31._44_4_ = (uint)bVar6 * auVar22._44_4_ | (uint)!bVar6 * auVar26._44_4_;
    bVar6 = (bool)(bVar11 >> 4 & 1);
    auVar31._48_4_ = (uint)bVar6 * auVar22._48_4_ | (uint)!bVar6 * auVar26._48_4_;
    bVar6 = (bool)(bVar11 >> 5 & 1);
    auVar31._52_4_ = (uint)bVar6 * auVar22._52_4_ | (uint)!bVar6 * auVar26._52_4_;
    bVar6 = (bool)(bVar11 >> 6 & 1);
    auVar31._56_4_ = (uint)bVar6 * auVar22._56_4_ | (uint)!bVar6 * auVar26._56_4_;
    auVar31._60_4_ =
         (uint)(bVar11 >> 7) * auVar22._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar26._60_4_;
    auVar21 = vextracti64x4_avx512f(auVar31,1);
    auVar22 = vpmulld_avx512f(auVar31,ZEXT3264(auVar21));
    auVar20 = vpmulld_avx(auVar22._0_16_,auVar22._16_16_);
    auVar7 = vpshufd_avx(auVar20,0xee);
    auVar20 = vpmulld_avx(auVar20,auVar7);
    auVar7 = vpshufd_avx(auVar20,0x55);
    auVar20 = vpmulld_avx(auVar20,auVar7);
    uVar44 = auVar20._0_4_;
    goto LAB_003568ab;
  }
  local_160.m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)(int)uVar43;
  uVar44 = 1;
  uVar43 = 1;
  if (uVar13 != 0) {
    uVar43 = local_108._0_4_;
  }
  local_160.m_xpr.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)(int)uVar43;
  local_160.m_xpr.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
       (long)(int)local_108._32_4_;
  local_160.m_xpr.m_rhs_xpr.m_broadcast._M_elems = (_Type)((ulong)(pTVar2->d).d[0] | 0x100000000);
  local_160.m_xpr.m_rhs_xpr.m_xpr.m_data = (StoragePointerType)local_108._40_8_;
  uVar43 = (fx->d).nd;
  uVar13 = (ulong)uVar43;
  local_160.m_xpr.m_lhs_xpr.m_data = pTVar3->v;
  local_160.m_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = lVar18;
  if (uVar13 == 0) {
LAB_003569c7:
    if (uVar44 != (fx->d).d[0]) {
LAB_00356ecf:
      __assert_fail("d.ndims() == 1 || d.batch_size() == d.rows()",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                    ,0xec,"Eigen::TensorMap<Eigen::Tensor<float, 2>> dynet::Tensor::tb()");
    }
  }
  else if (uVar43 != 1) {
    auVar22 = vpbroadcastq_avx512f();
    auVar23 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar16 = 0;
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar26 = vmovdqa64_avx512f(auVar23);
      auVar23 = vpbroadcastq_avx512f();
      auVar27 = vporq_avx512f(auVar23,auVar24);
      auVar23 = vporq_avx512f(auVar23,auVar25);
      uVar9 = vpcmpuq_avx512f(auVar23,auVar22,2);
      bVar10 = (byte)uVar9;
      uVar9 = vpcmpuq_avx512f(auVar27,auVar22,2);
      bVar11 = (byte)uVar9;
      uVar19 = CONCAT11(bVar11,bVar10);
      auVar23 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar16));
      auVar32._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar23._4_4_;
      auVar32._0_4_ = (uint)(bVar10 & 1) * auVar23._0_4_;
      auVar32._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar23._8_4_;
      auVar32._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar23._12_4_;
      auVar32._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar23._16_4_;
      auVar32._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar23._20_4_;
      auVar32._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar23._24_4_;
      auVar32._28_4_ = (uint)((byte)(uVar19 >> 7) & 1) * auVar23._28_4_;
      auVar32._32_4_ = (uint)(bVar11 & 1) * auVar23._32_4_;
      auVar32._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar23._36_4_;
      auVar32._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar23._40_4_;
      auVar32._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar23._44_4_;
      auVar32._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar23._48_4_;
      auVar32._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar23._52_4_;
      auVar32._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar23._56_4_;
      auVar32._60_4_ = (uint)(bVar11 >> 7) * auVar23._60_4_;
      auVar23 = vpmulld_avx512f(auVar32,auVar26);
      uVar16 = uVar16 + 0x10;
    } while ((uVar13 + 0xf & 0xfffffffffffffff0) != uVar16);
    auVar22 = vmovdqa32_avx512f(auVar23);
    auVar33._0_4_ = (uint)(bVar10 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar26._0_4_;
    bVar6 = (bool)((byte)(uVar19 >> 1) & 1);
    auVar33._4_4_ = (uint)bVar6 * auVar22._4_4_ | (uint)!bVar6 * auVar26._4_4_;
    bVar6 = (bool)((byte)(uVar19 >> 2) & 1);
    auVar33._8_4_ = (uint)bVar6 * auVar22._8_4_ | (uint)!bVar6 * auVar26._8_4_;
    bVar6 = (bool)((byte)(uVar19 >> 3) & 1);
    auVar33._12_4_ = (uint)bVar6 * auVar22._12_4_ | (uint)!bVar6 * auVar26._12_4_;
    bVar6 = (bool)((byte)(uVar19 >> 4) & 1);
    auVar33._16_4_ = (uint)bVar6 * auVar22._16_4_ | (uint)!bVar6 * auVar26._16_4_;
    bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
    auVar33._20_4_ = (uint)bVar6 * auVar22._20_4_ | (uint)!bVar6 * auVar26._20_4_;
    bVar6 = (bool)((byte)(uVar19 >> 6) & 1);
    auVar33._24_4_ = (uint)bVar6 * auVar22._24_4_ | (uint)!bVar6 * auVar26._24_4_;
    bVar6 = (bool)((byte)(uVar19 >> 7) & 1);
    auVar33._28_4_ = (uint)bVar6 * auVar22._28_4_ | (uint)!bVar6 * auVar26._28_4_;
    auVar33._32_4_ =
         (uint)(bVar11 & 1) * auVar22._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar26._32_4_;
    bVar6 = (bool)(bVar11 >> 1 & 1);
    auVar33._36_4_ = (uint)bVar6 * auVar22._36_4_ | (uint)!bVar6 * auVar26._36_4_;
    bVar6 = (bool)(bVar11 >> 2 & 1);
    auVar33._40_4_ = (uint)bVar6 * auVar22._40_4_ | (uint)!bVar6 * auVar26._40_4_;
    bVar6 = (bool)(bVar11 >> 3 & 1);
    auVar33._44_4_ = (uint)bVar6 * auVar22._44_4_ | (uint)!bVar6 * auVar26._44_4_;
    bVar6 = (bool)(bVar11 >> 4 & 1);
    auVar33._48_4_ = (uint)bVar6 * auVar22._48_4_ | (uint)!bVar6 * auVar26._48_4_;
    bVar6 = (bool)(bVar11 >> 5 & 1);
    auVar33._52_4_ = (uint)bVar6 * auVar22._52_4_ | (uint)!bVar6 * auVar26._52_4_;
    bVar6 = (bool)(bVar11 >> 6 & 1);
    auVar33._56_4_ = (uint)bVar6 * auVar22._56_4_ | (uint)!bVar6 * auVar26._56_4_;
    auVar33._60_4_ =
         (uint)(bVar11 >> 7) * auVar22._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar26._60_4_;
    auVar21 = vextracti64x4_avx512f(auVar33,1);
    auVar22 = vpmulld_avx512f(auVar33,ZEXT3264(auVar21));
    auVar20 = vpmulld_avx(auVar22._0_16_,auVar22._16_16_);
    auVar7 = vpshufd_avx(auVar20,0xee);
    auVar20 = vpmulld_avx(auVar20,auVar7);
    auVar7 = vpshufd_avx(auVar20,0x55);
    auVar20 = vpmulld_avx(auVar20,auVar7);
    uVar44 = auVar20._0_4_;
    goto LAB_003569c7;
  }
  local_a0.m_data = fx->v;
  uVar43 = 1;
  if (uVar13 != 0) {
    uVar43 = (fx->d).d[0];
  }
  local_a0.m_dimensions.super_array<long,_2>._M_elems[0] = (long)(int)uVar43;
  local_b0.m_lhs_xpr = &local_a0;
  local_b0.m_rhs_xpr = &local_160;
  local_a0.m_dimensions.super_array<long,_2>._M_elems[1] = lVar12;
  Eigen::internal::
  TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
  ::run(&local_b0,dev->edevice);
LAB_00356e34:
  std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::~vector(&local_58);
  std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::~vector(&local_d8);
  return;
}

Assistant:

void Softmax::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  if (xs[0]->d.cols() != 1)
    throw std::runtime_error("Softmax not yet implemented for multiple columns");
  Tensor z(Dim({1},fx.d.bd), (float*)aux_mem, fx.device, DeviceMempool::FXS);
  Tensor m(Dim({1},fx.d.bd), (float*)aux_mem + fx.d.bd, fx.device, DeviceMempool::FXS);
  logsumexp(dev, *xs[0], m, z);
  if(fx.d.bd == 1) {
    fx.t<1>().device(*dev.edevice) = (xs[0]->t<1>() - as_scalar(z)).exp();
  } else {
    Eigen::array<int, 2> bcast; bcast[0] = xs[0]->d.rows(); bcast[1] = 1;
    fx.tb<1>().device(*dev.edevice) = (xs[0]->tb<1>() - z.tb<1>().broadcast(bcast)).exp();
  }
}